

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall
GlobOpt::AddSubConstantInfo::Set
          (AddSubConstantInfo *this,StackSym *srcSym,Value *srcValue,bool srcValueIsLikelyConstant,
          int32 offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (srcSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x20,"(srcSym)","srcSym");
    if (!bVar2) goto LAB_004702a2;
    *puVar3 = 0;
  }
  if ((srcSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x21,"(!srcSym->IsTypeSpec())","!srcSym->IsTypeSpec()");
    if (!bVar2) goto LAB_004702a2;
    *puVar3 = 0;
  }
  if (srcValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x22,"(srcValue)","srcValue");
    if (!bVar2) goto LAB_004702a2;
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsLikelyInt(&srcValue->valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x23,"(srcValue->GetValueInfo()->IsLikelyInt())",
                       "srcValue->GetValueInfo()->IsLikelyInt()");
    if (!bVar2) {
LAB_004702a2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->srcSym = srcSym;
  this->srcValue = srcValue;
  this->srcValueIsLikelyConstant = srcValueIsLikelyConstant;
  this->offset = offset;
  return;
}

Assistant:

void GlobOpt::AddSubConstantInfo::Set(
    StackSym *const srcSym,
    Value *const srcValue,
    const bool srcValueIsLikelyConstant,
    const int32 offset)
{
    Assert(srcSym);
    Assert(!srcSym->IsTypeSpec());
    Assert(srcValue);
    Assert(srcValue->GetValueInfo()->IsLikelyInt());

    this->srcSym = srcSym;
    this->srcValue = srcValue;
    this->srcValueIsLikelyConstant = srcValueIsLikelyConstant;
    this->offset = offset;
}